

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * __thiscall ODDLParser::OpenDDLParser::parseStructure(OpenDDLParser *this,char *in,char *end)

{
  pointer ppDVar1;
  byte *pbVar2;
  byte bVar3;
  bool error;
  bool local_41;
  string local_40;
  
  if (in != end && in != (char *)0x0) {
    local_41 = false;
    do {
      bVar3 = *in;
      if ((0x2c < (ulong)bVar3) || ((0x100100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
      goto LAB_00644e28;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    bVar3 = *end;
    in = end;
LAB_00644e28:
    if (bVar3 == 0x7b) {
      do {
        in = parseStructureBody(this,in,end,&local_41);
        if ((byte *)in == (byte *)0x0) goto LAB_00644ecf;
      } while (*in != 0x7d);
      pbVar2 = (byte *)in + 1;
      in = (char *)pbVar2;
      while (((pbVar2 != (byte *)end && (in = (char *)pbVar2, (ulong)*pbVar2 < 0x2d)) &&
             ((0x100100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
        pbVar2 = pbVar2 + 1;
        in = end;
      }
      if ((local_41 == false) &&
         (ppDVar1 = (this->m_stack).
                    super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
         (this->m_stack).
         super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
         super__Vector_impl_data._M_start != ppDVar1)) {
        (this->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppDVar1 + -1;
      }
    }
    else {
      local_40.field_2._M_allocated_capacity._0_2_ = 0x7b;
      local_40._M_string_length = 1;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      logInvalidTokenError((char *)((byte *)in + 1),&local_40,this->m_logCallback);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,
                        CONCAT62(local_40.field_2._M_allocated_capacity._2_6_,
                                 local_40.field_2._M_allocated_capacity._0_2_) + 1);
      }
LAB_00644ecf:
      in = (char *)0x0;
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseStructure( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    bool error( false );
    in = lookForNextToken( in, end );
    if( *in == *Grammar::OpenBracketToken) {
        // loop over all children ( data and nodes )
        do {
            in = parseStructureBody( in, end, error );
            if(in == ddl_nullptr){
                return ddl_nullptr;
            }
        } while ( *in != *Grammar::CloseBracketToken);
        ++in;
    } else {
        ++in;
        logInvalidTokenError( in, std::string( Grammar::OpenBracketToken ), m_logCallback );
        return ddl_nullptr;
    }
    in = lookForNextToken( in, end );

    // pop node from stack after successful parsing
    if( !error ) {
        popNode();
    }

    return in;
}